

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySlotHandler.cpp
# Opt level: O1

void __thiscall MSX::PrimarySlot::PrimarySlot(PrimarySlot *this,MemorySlotChangeHandler *handler)

{
  this->supports_secondary_paging = false;
  MemorySlot::MemorySlot(this->subslots_,handler);
  MemorySlot::MemorySlot(this->subslots_ + 1,handler);
  MemorySlot::MemorySlot(this->subslots_ + 2,handler);
  MemorySlot::MemorySlot(this->subslots_ + 3,handler);
  this->secondary_paging_ = '\0';
  return;
}

Assistant:

PrimarySlot::PrimarySlot(MemorySlotChangeHandler &handler) :
	subslots_{handler, handler, handler, handler} {}